

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_update_alleles(bcf_hdr_t *hdr,bcf1_t *line,char **alleles,int nals)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  char **ppcVar9;
  char *__ptr;
  ulong uVar10;
  char *__ptr_00;
  ulong uVar11;
  ulong uVar12;
  
  uVar12 = (ulong)(uint)nals;
  if (nals < 1) {
    uVar10 = 0;
  }
  else {
    pcVar8 = (line->d).als;
    uVar4 = 0;
    do {
      if ((pcVar8 <= alleles[uVar4]) && (uVar10 = uVar4, alleles[uVar4] < pcVar8 + (line->d).m_als))
      break;
      uVar4 = uVar4 + 1;
      uVar10 = uVar12;
    } while (uVar12 != uVar4);
  }
  uVar4 = 0;
  pcVar8 = (line->d).als;
  if ((int)uVar10 == nals) {
    uVar4 = (ulong)(line->d).m_als;
    __ptr = (char *)0x0;
    __ptr_00 = pcVar8;
  }
  else {
    __ptr_00 = (char *)0x0;
    __ptr = pcVar8;
  }
  if (0 < nals) {
    uVar11 = 0;
    uVar10 = 0;
    do {
      pcVar8 = alleles[uVar11];
      sVar5 = strlen(pcVar8);
      sVar5 = (size_t)(int)sVar5;
      uVar6 = uVar10 + sVar5 + 1;
      pcVar7 = __ptr_00;
      if (uVar6 < uVar4) {
LAB_0012036c:
        __ptr_00 = pcVar7;
        memcpy(__ptr_00 + uVar10,pcVar8,sVar5);
        uVar10 = uVar10 + sVar5;
        __ptr_00[uVar10] = '\0';
      }
      else {
        uVar6 = uVar6 >> 1 | uVar6;
        uVar6 = uVar6 >> 2 | uVar6;
        uVar6 = uVar6 >> 4 | uVar6;
        uVar6 = uVar6 >> 8 | uVar6;
        uVar4 = (uVar6 >> 0x10 | uVar6) + 1;
        pcVar7 = (char *)realloc(__ptr_00,uVar4);
        if (pcVar7 != (char *)0x0) goto LAB_0012036c;
      }
      uVar6 = uVar10 + 1;
      pcVar8 = __ptr_00;
      if (uVar6 < uVar4) {
LAB_001203d6:
        (pcVar8 + uVar10)[0] = '\0';
        (pcVar8 + uVar10)[1] = '\0';
        uVar10 = uVar6;
        __ptr_00 = pcVar8;
      }
      else {
        uVar4 = uVar6 >> 1 | uVar6;
        uVar4 = uVar4 >> 2 | uVar4;
        uVar4 = uVar4 >> 4 | uVar4;
        uVar4 = uVar4 >> 8 | uVar4;
        uVar4 = (uVar4 >> 0x10 | uVar4) + 1;
        pcVar8 = (char *)realloc(__ptr_00,uVar4);
        if (pcVar8 != (char *)0x0) goto LAB_001203d6;
      }
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  (line->d).als = __ptr_00;
  (line->d).m_als = (int)uVar4;
  free(__ptr);
  piVar1 = &(line->d).shared_dirty;
  *(byte *)piVar1 = (byte)*piVar1 | 2;
  *(short *)&line->field_0x12 = (short)nals;
  if ((line->d).m_allele < (int)(nals & 0xffffU)) {
    uVar3 = (nals & 0xffffU) - 1;
    uVar3 = (int)uVar3 >> 1 | uVar3;
    uVar3 = (int)uVar3 >> 2 | uVar3;
    uVar3 = (int)uVar3 >> 4 | uVar3;
    uVar3 = (int)uVar3 >> 8 | uVar3;
    uVar3 = (int)uVar3 >> 0x10 | uVar3;
    (line->d).m_allele = uVar3 + 1;
    ppcVar9 = (char **)realloc((line->d).allele,(long)(int)uVar3 * 8 + 8);
    (line->d).allele = ppcVar9;
  }
  if (0 < nals) {
    pcVar8 = (line->d).als;
    uVar10 = 0;
    do {
      (line->d).allele[uVar10] = pcVar8;
      do {
        cVar2 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (cVar2 != '\0');
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar12);
  }
  return 0;
}

Assistant:

int bcf_update_alleles(const bcf_hdr_t *hdr, bcf1_t *line, const char **alleles, int nals)
{
    kstring_t tmp = {0,0,0};
    char *free_old = NULL;

    // If the supplied alleles are not pointers to line->d.als, the existing block can be reused.
    int i;
    for (i=0; i<nals; i++)
        if ( alleles[i]>=line->d.als && alleles[i]<line->d.als+line->d.m_als ) break;
    if ( i==nals )
    {
        // all alleles point elsewhere, reuse the existing block
        tmp.l = 0; tmp.s = line->d.als; tmp.m = line->d.m_als;
    }
    else
        free_old = line->d.als;

    for (i=0; i<nals; i++)
    {
        kputs(alleles[i], &tmp);
        kputc(0, &tmp);
    }
    line->d.als = tmp.s; line->d.m_als = tmp.m;
    free(free_old);
    return _bcf1_sync_alleles(hdr,line,nals);
}